

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_linklist_test.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  uo_linklist *puVar33;
  uo_linklist *puVar34;
  uo_linklist *puVar35;
  uo_linklist *puVar36;
  uo_linklist *puVar37;
  uo_linklist *puVar38;
  uo_linklist *puVar39;
  uo_linklist uVar40;
  uo_linklist *puVar41;
  uo_linklist *puVar42;
  uo_linklist uVar43;
  uo_linklist uVar44;
  int iVar45;
  int iVar46;
  uo_linklist *puVar47;
  int iVar48;
  uo_linklist *puVar49;
  int iVar50;
  bool bVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  uo_linklist *puVar55;
  int iVar56;
  bool bVar57;
  int iVar58;
  int iVar61;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  undefined1 auVar65 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  uo_linklist link3;
  uo_linklist link2;
  uo_linklist link1;
  int local_148;
  int iStack_144;
  int local_118;
  int iStack_114;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  uo_linklist local_78;
  uo_linklist local_68;
  uo_linklist local_58;
  uo_linklist local_48;
  
  local_58 = (uo_linklist)ZEXT816(0);
  local_68 = (uo_linklist)ZEXT816(0);
  local_78 = (uo_linklist)ZEXT816(0);
  local_48.next = &local_48;
  local_48.prev = &local_48;
  uo__linklist_link(&local_48,&local_58);
  iVar58 = (int)&local_58;
  iVar61 = (int)((ulong)&local_58 >> 0x20);
  local_148 = (int)&local_48;
  iStack_144 = (int)((ulong)&local_48 >> 0x20);
  bVar8 = (int)local_48.next == iVar58;
  bVar14 = local_48.next._4_4_ == iVar61;
  bVar20 = (int)local_48.prev == iVar58;
  bVar26 = local_48.prev._4_4_ == iVar61;
  bVar9 = (int)local_58.next == local_148;
  bVar15 = local_58.next._4_4_ == iStack_144;
  bVar21 = (int)local_58.prev == local_148;
  bVar27 = local_58.prev._4_4_ == iStack_144;
  uo__linklist_link(&local_48,&local_68);
  bVar10 = (int)local_68.next == local_148;
  bVar16 = local_68.next._4_4_ == iStack_144;
  bVar22 = (int)local_68.prev == iVar58;
  bVar28 = local_68.prev._4_4_ == iVar61;
  bVar51 = iVar58 == (int)local_48.next;
  bVar2 = iVar61 == local_48.next._4_4_;
  iVar66 = (int)&local_68;
  bVar4 = iVar66 == (int)local_48.prev;
  iVar68 = (int)((ulong)&local_68 >> 0x20);
  bVar6 = iVar68 == local_48.prev._4_4_;
  bVar11 = (int)local_58.next == iVar66;
  bVar17 = local_58.next._4_4_ == iVar68;
  bVar23 = (int)local_58.prev == local_148;
  bVar29 = local_58.prev._4_4_ == iStack_144;
  uo__linklist_link(&local_48,&local_78);
  puVar49 = local_48.prev;
  puVar47 = local_48.next;
  puVar41 = local_78.prev;
  bVar57 = local_78.next != &local_48;
  iVar54 = (int)local_58.next;
  iVar56 = local_58.next._4_4_;
  iVar45 = (int)local_58.prev;
  iVar46 = local_58.prev._4_4_;
  iVar52 = (int)local_48.next;
  iVar53 = local_48.next._4_4_;
  iVar48 = (int)local_48.prev;
  iVar50 = local_48.prev._4_4_;
  puVar36 = local_68.next;
  puVar35 = local_68.prev;
  (local_78.next)->prev = local_78.prev;
  (local_78.prev)->next = local_78.next;
  bVar1 = (int)local_58.next == iVar66;
  bVar3 = local_58.next._4_4_ == iVar68;
  bVar5 = (int)local_58.prev == local_148;
  bVar7 = local_58.prev._4_4_ == iStack_144;
  bVar12 = (int)local_48.next == iVar58;
  bVar18 = local_48.next._4_4_ == iVar61;
  iVar67 = (int)&local_78;
  bVar24 = (int)local_48.prev == iVar67;
  iVar69 = (int)((ulong)&local_78 >> 0x20);
  bVar30 = local_48.prev._4_4_ == iVar69;
  bVar13 = (int)local_68.next == iVar67;
  bVar19 = local_68.next._4_4_ == iVar69;
  bVar25 = (int)local_68.prev == iVar58;
  bVar31 = local_68.prev._4_4_ == iVar61;
  local_78.next = (uo_linklist *)0x0;
  local_78.prev = (uo_linklist *)0x0;
  puVar36->prev = puVar35;
  puVar35->next = puVar36;
  local_68.next = (uo_linklist *)0x0;
  local_68.prev = (uo_linklist *)0x0;
  (local_58.next)->prev = local_58.prev;
  (local_58.prev)->next = local_58.next;
  local_58.next = (uo_linklist *)0x0;
  local_58.prev = (uo_linklist *)0x0;
  (local_48.next)->prev = local_48.prev;
  (local_48.prev)->next = local_48.next;
  uVar44 = local_58;
  uVar43 = local_68;
  uVar40 = local_78;
  local_48.next = &local_48;
  local_48.prev = &local_48;
  uo__linklist_link(&local_48,&local_58);
  uo__linklist_link(&local_58,&local_68);
  puVar55 = &local_68;
  uo__linklist_link(&local_68,&local_78);
  local_118 = (int)uVar40.next;
  iStack_114 = uVar40.next._4_4_;
  auVar71._0_4_ = -(uint)(local_118 == 0);
  auVar71._4_4_ = -(uint)(iStack_114 == 0);
  auVar71._8_4_ = -(uint)(local_148 == iVar52);
  auVar71._12_4_ = -(uint)(iStack_144 == iVar53);
  puVar39 = local_78.next;
  puVar42 = local_78.prev;
  puVar37 = local_68.next;
  puVar38 = local_68.prev;
  puVar33 = local_58.next;
  puVar34 = local_58.prev;
  puVar39->prev = puVar42;
  puVar42->next = puVar39;
  auVar65._0_4_ = -(uint)(iVar66 == (int)local_48.next);
  auVar65._4_4_ = -(uint)(iVar68 == (int)((ulong)local_48.next >> 0x20));
  auVar65._8_4_ = -(uint)(iVar66 == iVar48);
  auVar65._12_4_ = -(uint)(iVar68 == iVar50);
  auVar32._4_4_ =
       -(uint)(((bVar19 && bVar17) && (bVar15 && bVar18)) &&
              ((bVar2 && bVar3) && (bVar16 && bVar14)));
  auVar32._0_4_ =
       -(uint)(((bVar13 && bVar11) && (bVar12 && bVar9)) && ((bVar1 && bVar51) && (bVar10 && bVar8))
              );
  auVar32._8_4_ =
       -(uint)(((bVar25 && bVar23) && (bVar24 && bVar21)) &&
              ((bVar5 && bVar4) && (bVar22 && bVar20)));
  auVar32._12_4_ =
       -(uint)(((bVar31 && bVar29) && (bVar30 && bVar27)) &&
              ((bVar6 && bVar7) && (bVar28 && bVar26)));
  iVar52 = movmskps(local_78.next._0_4_,auVar32);
  local_b8 = (int)uVar43.next;
  iStack_b4 = uVar43.next._4_4_;
  iStack_b0 = (int)uVar44.next;
  iStack_ac = uVar44.next._4_4_;
  auVar73._0_4_ = -(uint)(local_b8 == 0);
  auVar73._4_4_ = -(uint)(iStack_b4 == 0);
  auVar73._8_4_ = -(uint)(iStack_b0 == 0);
  auVar73._12_4_ = -(uint)(iStack_ac == 0);
  auVar70._0_4_ = -(uint)((int)local_48.prev == iVar58);
  auVar70._4_4_ = -(uint)((int)((ulong)local_48.prev >> 0x20) == iVar61);
  auVar70._8_4_ = 0xffffffff;
  auVar70._12_4_ = 0xffffffff;
  auVar72._8_4_ = 0xffffffff;
  auVar72._0_8_ = 0xffffffffffffffff;
  auVar72._12_4_ = 0xffffffff;
  iVar53 = movmskps(local_78.prev._0_4_,auVar70 & auVar72 & auVar73 & auVar71);
  local_78.next = (uo_linklist *)0x0;
  puVar37->prev = puVar38;
  puVar38->next = puVar37;
  auVar64._0_4_ = -(uint)(iVar54 == iVar66);
  auVar64._4_4_ = -(uint)(iVar56 == iVar68);
  auVar64._8_4_ = -(uint)(iVar54 == local_148);
  auVar64._12_4_ = -(uint)(iVar56 == iStack_144);
  auVar63._0_4_ = -(uint)(iVar45 == local_148);
  auVar63._4_4_ = -(uint)(iVar46 == iStack_144);
  auVar63._8_4_ = -(uint)((int)local_58.prev == iVar66);
  auVar63._12_4_ = -(uint)(local_58.prev._4_4_ == iVar68);
  auVar62._0_4_ = -(uint)((int)local_58.next == local_148);
  auVar62._4_4_ = -(uint)(local_58.next._4_4_ == iStack_144);
  auVar62._8_4_ = -(uint)(iVar45 == local_148);
  auVar62._12_4_ = -(uint)(iVar46 == iStack_144);
  local_68.prev = (uo_linklist *)0x0;
  puVar33->prev = puVar34;
  puVar34->next = puVar33;
  local_58.next = (uo_linklist *)0x0;
  iVar54 = movmskps((int)puVar55,auVar62 & auVar65 & auVar63 & auVar64);
  auVar59._0_4_ =
       (-(uint)(&local_78 == local_48.next) ^ 0xffffffff |
        -(uint)(&local_48 == puVar36) ^ 0xffffffff |
       -(uint)(&local_58 == puVar37) ^ 0xffffffff | -(uint)(&local_48 == puVar33) ^ 0xffffffff) <<
       0x1f;
  auVar59._4_4_ =
       (-(uint)(local_48.prev == &local_58) ^ 0xffffffff |
        -(uint)(&local_58 == puVar35) ^ 0xffffffff |
       -(uint)(&local_48 == puVar38) ^ 0xffffffff | -(uint)(&local_68 == puVar34) ^ 0xffffffff) <<
       0x1f;
  auVar59._8_4_ =
       (-(uint)(&local_68 == puVar39) ^ 0xffffffff | -(uint)(&local_58 == puVar47) ^ 0xffffffff |
       -(uint)(local_48.next == &local_58) ^ 0xffffffff | -(uint)(&local_58 == puVar37) ^ 0xffffffff
       ) << 0x1f;
  auVar59._12_4_ =
       (-(uint)(&local_48 == puVar42) ^ 0xffffffff | -(uint)(&local_58 == puVar49) ^ 0xffffffff |
       -(uint)(&local_58 == local_48.prev) ^ 0xffffffff | -(uint)(&local_78 == puVar38) ^ 0xffffffff
       ) << 0x1f;
  (local_48.next)->prev = local_48.prev;
  (local_48.prev)->next = local_48.next;
  iVar56 = movmskps((int)local_48.prev,auVar59);
  auVar60._0_4_ = -(uint)((int)local_58.next == 0);
  auVar60._4_4_ = -(uint)(local_58.next._4_4_ == 0);
  auVar60._8_4_ = -(uint)((int)local_68.prev == 0);
  auVar60._12_4_ = -(uint)(local_68.prev._4_4_ == 0);
  bVar51 = ((&local_48 != local_48.next || (puVar33 != &local_48 || puVar34 != &local_48)) ||
           ((puVar47 != &local_58 || puVar41 != &local_68) || bVar57)) || iVar54 != 0xf;
  iVar54 = movmskps(CONCAT31((int3)((uint)iVar52 >> 8),bVar51),auVar60);
  return (int)((iVar54 != 0xf || local_78.next != (uo_linklist *)0x0) ||
              ((iVar56 != 0 || (iVar53 != 0xf || iVar52 != 0xf)) || bVar51));
}

Assistant:

int main(
    int argc, 
    char const **argv)
{
    bool passed = true;

    uo_linklist head;
    uo_linklist link1;
    uo_linklist link2;
    uo_linklist link3;

    uo_linklist_selflink(&head);
    uo_linklist_reset(&link1);
    uo_linklist_reset(&link2);
    uo_linklist_reset(&link3);

    passed &= uo_linklist_is_empty(&head);
    passed &= !uo_linklist_is_linked(&link1);
    passed &= !uo_linklist_is_linked(&link1);
    passed &= !uo_linklist_is_linked(&link3);

    uo_linklist_link(&head, &link1);
    passed &= !uo_linklist_is_empty(&head);
    passed &= head.next == &link1;
    passed &= head.prev == &link1;
    passed &= link1.next == &head;
    passed &= link1.prev == &head;

    uo_linklist_link(&head, &link2);
    passed &= head.next == &link1;
    passed &= head.prev == &link2;
    passed &= link1.next == &link2;
    passed &= link1.prev == &head;
    passed &= link2.next == &head;
    passed &= link2.prev == &link1;

    uo_linklist_link(&head, &link3);
    passed &= head.next == &link1;
    passed &= head.prev == &link3;
    passed &= link1.next == &link2;
    passed &= link1.prev == &head;
    passed &= link2.next == &link3;
    passed &= link2.prev == &link1;
    passed &= link3.next == &head;
    passed &= link3.prev == &link2;

    uo_linklist_unlink(&link3);
    passed &= head.next == &link1;
    passed &= head.prev == &link2;
    passed &= link1.next == &link2;
    passed &= link1.prev == &head;
    passed &= link2.next == &head;
    passed &= link2.prev == &link1;
    passed &= !uo_linklist_is_linked(&link3);

    uo_linklist_unlink(&link2);
    passed &= head.next == &link1;
    passed &= head.prev == &link1;
    passed &= link1.next == &head;
    passed &= link1.prev == &head;
    passed &= !uo_linklist_is_linked(&link2);
    passed &= !uo_linklist_is_linked(&link3);

    uo_linklist_unlink(&link1);
    passed &= uo_linklist_is_empty(&head);
    passed &= !uo_linklist_is_linked(&link1);
    passed &= !uo_linklist_is_linked(&link2);
    passed &= !uo_linklist_is_linked(&link3);

    uo_linklist_unlink(&head);
    passed &= !uo_linklist_is_linked(&head);
    passed &= !uo_linklist_is_linked(&link1);
    passed &= !uo_linklist_is_linked(&link2);
    passed &= !uo_linklist_is_linked(&link3);

    uo_linklist_selflink(&head);
    uo_linklist_link(&head, &link1);
    uo_linklist_link(&link1, &link2);
    uo_linklist_link(&link2, &link3);
    passed &= head.prev == &link1;
    passed &= head.next == &link3;
    passed &= link1.prev == &link2;
    passed &= link1.next == &head;
    passed &= link2.prev == &link3;
    passed &= link2.next == &link1;
    passed &= link3.prev == &head;
    passed &= link3.next == &link2;

    uo_linklist_unlink(&link3);
    passed &= head.prev == &link1;
    passed &= head.next == &link2;
    passed &= link1.prev == &link2;
    passed &= link1.next == &head;
    passed &= link2.prev == &head;
    passed &= link2.next == &link1;
    passed &= !uo_linklist_is_linked(&link3);

    uo_linklist_unlink(&link2);
    passed &= head.prev == &link1;
    passed &= head.next == &link1;
    passed &= link1.prev == &head;
    passed &= link1.next == &head;
    passed &= !uo_linklist_is_linked(&link2);
    passed &= !uo_linklist_is_linked(&link3);

    uo_linklist_unlink(&link1);
    passed &= uo_linklist_is_empty(&head);
    passed &= !uo_linklist_is_linked(&link1);
    passed &= !uo_linklist_is_linked(&link2);
    passed &= !uo_linklist_is_linked(&link3);

    uo_linklist_unlink(&head);
    passed &= !uo_linklist_is_linked(&head);
    passed &= !uo_linklist_is_linked(&link1);
    passed &= !uo_linklist_is_linked(&link2);
    passed &= !uo_linklist_is_linked(&link3);

    return passed ? 0 : 1;
}